

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_features_state(lys_module *module,char *feature)

{
  byte bVar1;
  byte bVar2;
  lys_feature *plVar3;
  lys_submodule *plVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *puVar10;
  
  uVar7 = 0xffffffff;
  if (feature != (char *)0x0 && module != (lys_module *)0x0) {
    bVar1 = module->features_size;
    lVar5 = -0x40;
    do {
      lVar8 = lVar5;
      if ((ulong)bVar1 * 0x40 == lVar8 + 0x40) {
        bVar1 = module->inc_size;
        uVar9 = 0;
        do {
          if (uVar9 == bVar1) {
            return -1;
          }
          plVar4 = module->inc[uVar9].submodule;
          bVar2 = plVar4->features_size;
          lVar5 = -0x40;
          while (lVar8 = lVar5, (ulong)bVar2 * 0x40 != lVar8 + 0x40) {
            plVar3 = plVar4->features;
            iVar6 = strcmp(feature,*(char **)(plVar3[1].padding + lVar8 + -0x1c));
            lVar5 = lVar8 + 0x40;
            if (iVar6 == 0) {
              puVar10 = plVar3[1].padding + lVar8 + -0x1c;
              goto LAB_0015c3c3;
            }
          }
          uVar9 = uVar9 + 1;
        } while( true );
      }
      plVar3 = module->features;
      iVar6 = strcmp(feature,*(char **)(plVar3[1].padding + lVar8 + -0x1c));
      lVar5 = lVar8 + 0x40;
    } while (iVar6 != 0);
    puVar10 = plVar3[1].padding + lVar8 + -0x1c;
LAB_0015c3c3:
    uVar7 = *(uint *)(puVar10 + 0x18) >> 8 & 1;
  }
  return uVar7;
}

Assistant:

API int
lys_features_state(const struct lys_module *module, const char *feature)
{
    int i, j;

    if (!module || !feature) {
        return -1;
    }

    /* search for the specified feature */
    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        if (!strcmp(feature, module->features[i].name)) {
            if (module->features[i].flags & LYS_FENABLED) {
                return 1;
            } else {
                return 0;
            }
        }
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            if (!strcmp(feature, module->inc[j].submodule->features[i].name)) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    return 1;
                } else {
                    return 0;
                }
            }
        }
    }

    /* feature definition not found */
    return -1;
}